

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_create_type.cpp
# Opt level: O3

Vector * __thiscall
duckdb::Transformer::PGListToVector
          (Vector *__return_storage_ptr__,Transformer *this,
          optional_ptr<duckdb_libpgquery::PGList,_true> column_list,idx_t *size)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  PGListCell *pPVar3;
  ParserException *this_00;
  idx_t *piVar4;
  _Alloc_hider _Var5;
  Vector *result;
  string_t sVar6;
  string entry_value;
  allocator local_99;
  optional_ptr<duckdb_libpgquery::PGList,_true> local_98;
  string local_90;
  uint local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  LogicalType local_60;
  LogicalType local_48;
  
  local_98.ptr = column_list.ptr;
  if (column_list.ptr == (PGList *)0x0) {
    LogicalType::LogicalType(&local_48,VARCHAR);
    Vector::Vector(__return_storage_ptr__,&local_48,0x800);
    LogicalType::~LogicalType(&local_48);
  }
  else {
    piVar4 = size;
    optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&local_98);
    pPVar3 = (local_98.ptr)->head;
    if (pPVar3 != (PGListCell *)0x0) {
      piVar4 = (idx_t *)*size;
      do {
        piVar4 = (idx_t *)((long)piVar4 + 1);
        pPVar3 = pPVar3->next;
      } while (pPVar3 != (PGListCell *)0x0);
      *size = (idx_t)piVar4;
    }
    LogicalType::LogicalType(&local_60,VARCHAR);
    Vector::Vector(__return_storage_ptr__,&local_60,*size);
    LogicalType::~LogicalType(&local_60);
    pdVar1 = __return_storage_ptr__->data;
    *size = 0;
    optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&local_98);
    pPVar3 = (local_98.ptr)->head;
    if (pPVar3 != (PGListCell *)0x0) {
      do {
        local_90._M_dataplus._M_p = (pointer)(pPVar3->data).ptr_value;
        optional_ptr<duckdb_libpgquery::PGAConst,_true>::CheckValid
                  ((optional_ptr<duckdb_libpgquery::PGAConst,_true> *)&local_90);
        if (*(int *)(local_90._M_dataplus._M_p + 8) != 0xdb) {
          this_00 = (ParserException *)__cxa_allocate_exception(0x10);
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_90,"Expected a string constant as value","");
          ParserException::ParserException(this_00,&local_90);
          __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::__cxx11::string::string
                  ((string *)&local_90,*(char **)(local_90._M_dataplus._M_p + 0x10),&local_99);
        local_70 = (uint)local_90._M_string_length;
        if (local_70 < 0xd) {
          uStack_64 = 0;
          uStack_6c = 0;
          uStack_68 = 0;
          if (local_70 == 0) {
            _Var5._M_p = (pointer)0x0;
          }
          else {
            switchD_015de399::default(&uStack_6c,local_90._M_dataplus._M_p,(ulong)(local_70 & 0xf));
            _Var5._M_p = (pointer)CONCAT44(uStack_64,uStack_68);
          }
        }
        else {
          uStack_6c = *(undefined4 *)local_90._M_dataplus._M_p;
          uStack_68 = SUB84(local_90._M_dataplus._M_p,0);
          uStack_64 = (undefined4)((ulong)local_90._M_dataplus._M_p >> 0x20);
          _Var5._M_p = local_90._M_dataplus._M_p;
        }
        sVar6.value.pointer.ptr = (char *)piVar4;
        sVar6.value._0_8_ = _Var5._M_p;
        sVar6 = StringVector::AddStringOrBlob
                          ((StringVector *)__return_storage_ptr__,
                           (Vector *)CONCAT44(uStack_6c,local_70),sVar6);
        iVar2 = *size;
        *size = iVar2 + 1;
        piVar4 = (idx_t *)(iVar2 * 0x10);
        *(long *)(pdVar1 + (long)piVar4) = sVar6.value._0_8_;
        *(long *)(pdVar1 + 8 + (long)piVar4) = sVar6.value._8_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        pPVar3 = pPVar3->next;
      } while (pPVar3 != (PGListCell *)0x0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Vector Transformer::PGListToVector(optional_ptr<duckdb_libpgquery::PGList> column_list, idx_t &size) {
	if (!column_list) {
		Vector result(LogicalType::VARCHAR);
		return result;
	}
	// First we discover the size of this list
	for (auto c = column_list->head; c != nullptr; c = lnext(c)) {
		size++;
	}

	Vector result(LogicalType::VARCHAR, size);
	auto result_ptr = FlatVector::GetData<string_t>(result);

	size = 0;
	for (auto c = column_list->head; c != nullptr; c = lnext(c)) {
		auto &type_val = *PGPointerCast<duckdb_libpgquery::PGAConst>(c->data.ptr_value);
		auto &entry_value_node = type_val.val;
		if (entry_value_node.type != duckdb_libpgquery::T_PGString) {
			throw ParserException("Expected a string constant as value");
		}

		auto entry_value = string(entry_value_node.val.str);
		D_ASSERT(!entry_value.empty());
		result_ptr[size++] = StringVector::AddStringOrBlob(result, entry_value);
	}
	return result;
}